

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O1

int __thiscall Server::Private::remove(Private *this,char *__filename)

{
  int iVar1;
  
  if (*(long *)(__filename + 0x10) != 0) {
    *(undefined8 *)(*(long *)(__filename + 0x10) + 0xa8) = 0;
  }
  Socket::Poll::remove(&this->_sockets,__filename);
  iVar1 = PoolList<Server::Private::EstablisherImpl>::remove(&this->_establishers,__filename);
  return iVar1;
}

Assistant:

void Server::Private::remove(EstablisherImpl &establisher)
{
  if (establisher.resolver)
    establisher.resolver->establisher = 0;
  _sockets.remove(establisher);
  _establishers.remove(establisher);
}